

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall
Variable_addEquivalenceFirstParameterNullptr_Test::TestBody
          (Variable_addEquivalenceFirstParameterNullptr_Test *this)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  byte bVar4;
  AssertionResult local_88 [2];
  AssertHelper local_68 [8];
  Message local_60 [8];
  VariablePtr v1;
  AssertionResult gtest_ar_;
  ComponentPtr comp1;
  ModelPtr m;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Variable::create();
  peVar3 = m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"modelName",(allocator<char> *)&gtest_ar_);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string((string *)local_88);
  peVar2 = comp1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"component1",(allocator<char> *)&gtest_ar_);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string((string *)local_88);
  peVar1 = v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"variable1",(allocator<char> *)&gtest_ar_);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"dimensionless",(allocator<char> *)&gtest_ar_);
  libcellml::Variable::setUnits
            ((string *)v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  std::__cxx11::string::~string((string *)local_88);
  libcellml::Component::addVariable
            ((shared_ptr *)
             comp1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  local_88[0]._0_8_ = (char *)0x0;
  local_88[0].message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar4 = libcellml::Variable::addEquivalence((shared_ptr *)local_88,(shared_ptr *)&v1);
  gtest_ar_.success_ = (bool)(bVar4 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88[0].message_);
  if (bVar4 != 0) {
    testing::Message::Message(local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_88,&gtest_ar_.success_,"libcellml::Variable::addEquivalence(nullptr, v1)",
               "true");
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x53c,(char *)local_88[0]._0_8_);
    testing::internal::AssertHelper::operator=(local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    std::__cxx11::string::~string((string *)local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&comp1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Variable, addEquivalenceFirstParameterNullptr)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();

    m->setName("modelName");
    comp1->setName("component1");

    v1->setName("variable1");

    v1->setUnits("dimensionless");

    comp1->addVariable(v1);

    m->addComponent(comp1);

    EXPECT_FALSE(libcellml::Variable::addEquivalence(nullptr, v1));
}